

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Scope.h
# Opt level: O0

void __thiscall Nova::Log::Log_Scope::Dump_Names(Log_Scope *this,FILE *output)

{
  size_t sVar1;
  Log_Entry **ppLVar2;
  int local_1c;
  int i;
  FILE *output_local;
  Log_Scope *this_local;
  
  Log_Entry::Dump_Names(&this->super_Log_Entry,output);
  local_1c = 0;
  while( true ) {
    sVar1 = Array<Nova::Log::Log_Entry_*>::size(&this->children);
    if (sVar1 <= (ulong)(long)local_1c) break;
    ppLVar2 = Array<Nova::Log::Log_Entry_*>::operator()(&this->children,local_1c);
    (*(*ppLVar2)->_vptr_Log_Entry[8])(*ppLVar2,output);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Dump_Names(FILE* output)
    {Log_Entry::Dump_Names(output);for(int i=0;i<children.size();++i)children(i)->Dump_Names(output);}